

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_15::BinaryReaderObjdump::OnStructType
          (BinaryReaderObjdump *this,Index index,Index field_count,TypeMut *fields)

{
  undefined4 in_register_00000034;
  ulong uVar1;
  bool bVar2;
  string local_50;
  
  if ((((this->super_BinaryReaderObjdumpBase).options_)->mode == Details) &&
     (((this->super_BinaryReaderObjdumpBase).print_details_ & 1U) != 0)) {
    printf(" - type[%u] (struct",CONCAT44(in_register_00000034,index));
    uVar1 = (ulong)field_count;
    while (bVar2 = uVar1 != 0, uVar1 = uVar1 - 1, bVar2) {
      if (fields->mutable_ == true) {
        printf(" (mut");
      }
      Type::GetName_abi_cxx11_(&local_50,&fields->type);
      printf(" %s",local_50._M_dataplus._M_p);
      std::__cxx11::string::_M_dispose();
      if (fields->mutable_ == true) {
        putchar(0x29);
      }
      fields = fields + 1;
    }
    puts(")");
  }
  return (Result)Ok;
}

Assistant:

bool BinaryReaderObjdump::ShouldPrintDetails() {
  if (options_->mode != ObjdumpMode::Details) {
    return false;
  }
  return print_details_;
}